

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_8::DiskFile::copy(DiskFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint __fd;
  Fault FVar1;
  int iVar2;
  int iVar3;
  Exception *pEVar4;
  ulong uVar5;
  __off_t _Var6;
  ssize_t sVar7;
  size_t __n;
  ulong uVar8;
  Exception *in_RCX;
  int line;
  stat *__buf;
  stat *__buf_00;
  Exception *pEVar9;
  DiskHandle *this_00;
  ulong uVar10;
  ulong in_R8;
  Exception *pEVar11;
  size_t __nbytes;
  uint64_t size;
  EVP_PKEY_CTX *pEVar12;
  Fault f_2;
  Fault f;
  long local_1030;
  
  (*(code *)**(undefined8 **)src)(&f,src);
  if ((char)f.exception != '\x01') {
    iVar2 = File::copy(&this->super_File,dst,src);
    return iVar2;
  }
  this_00 = &this->super_DiskHandle;
  __fd = f.exception._4_4_;
  pEVar11 = (Exception *)(long)(int)f.exception._4_4_;
  pEVar9 = in_RCX;
  if (in_R8 == 0xffffffffffffffff && (in_RCX == (Exception *)0x0 && dst == (EVP_PKEY_CTX *)0x0)) {
    DiskHandle::stat((DiskHandle *)&f,(char *)this_00,__buf);
    if (local_1030 == 0) {
      iVar2 = ioctl((this_00->fd).fd,0x40049409,(ulong)__fd);
      pEVar11 = (Exception *)0x7fffffffffffffff;
      if (-1 < iVar2) {
        DiskHandle::stat((DiskHandle *)&f,(char *)this_00,__buf_00);
        return 0;
      }
      goto LAB_00282839;
    }
  }
  else if (in_R8 == 0) {
    return 0;
  }
  f_2.exception = pEVar11;
  iVar2 = ioctl((this_00->fd).fd,0x4020940d);
  if (-1 < iVar2) {
    (**(code **)(*(long *)src + 0x10))(&f,src);
    uVar5 = local_1030 - (long)in_RCX;
    if (in_R8 <= (ulong)(local_1030 - (long)in_RCX)) {
      uVar5 = in_R8;
    }
    return (int)uVar5;
  }
  pEVar11 = (Exception *)0x7fffffffffffffff;
  if (in_R8 != 0xffffffffffffffff) {
    pEVar11 = (Exception *)((long)in_RCX->trace + (in_R8 - 0x50));
  }
LAB_00282839:
  pEVar4 = (Exception *)lseek(__fd,(__off_t)pEVar9,4);
  iVar2 = (int)in_RCX;
  if ((long)pEVar4 < 0) {
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
    if (iVar3 == -1) goto LAB_00282839;
    if ((iVar3 != 0) && (pEVar4 = pEVar11, iVar3 != 0x16)) {
      if (iVar3 == 6) goto LAB_00282ae1;
      line = 0x240;
      goto LAB_00282b3c;
    }
  }
  if ((long)pEVar11 < (long)pEVar4) {
    pEVar4 = pEVar11;
  }
  uVar5 = (long)pEVar4 - (long)pEVar9;
  if (uVar5 != 0) {
    do {
      _Var6 = lseek((this_00->fd).fd,(__off_t)dst,0);
      FVar1.exception = pEVar9;
      if (-1 < _Var6) goto LAB_002828b1;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x1ed,iVar3,"lseek(fd, offset, SEEK_SET)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_002828b1:
    do {
      f.exception = FVar1.exception;
      if ((long)pEVar4 <= (long)f.exception) goto LAB_00282a0e;
      do {
        sVar7 = sendfile((this_00->fd).fd,__fd,(off_t *)&f,(long)pEVar4 - (long)f.exception);
        if (-1 < sVar7) {
          FVar1 = f;
          if (sVar7 == 0) goto LAB_00282a0e;
          goto LAB_002828b1;
        }
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      FVar1 = f;
      if (iVar3 != 0) {
        if ((iVar3 == 0x16) || (iVar3 == 0x26)) {
          uVar8 = 0;
          pEVar4 = pEVar9;
          pEVar12 = dst;
          for (uVar10 = uVar5; uVar10 != 0; uVar10 = uVar10 - __n) {
            __nbytes = 0x1000;
            if (uVar10 < 0x1000) {
              __nbytes = uVar10;
            }
            do {
              __n = pread(__fd,&f,__nbytes,(__off_t)pEVar4);
              if (-1 < (long)__n) {
                if (__n == 0) goto LAB_00282a11;
                goto LAB_00282973;
              }
              iVar3 = kj::_::Debug::getOsErrorNumber(false);
            } while (iVar3 == -1);
            if (iVar3 != 0) {
              kj::_::Debug::Fault::Fault
                        (&f_2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,0x204,iVar3,
                         "n = pread(fromFd, buffer, kj::min(sizeof(buffer), size), fromOffset)","");
              kj::_::Debug::Fault::fatal(&f_2);
            }
LAB_00282973:
            DiskHandle::write(this_00,(int)pEVar12,&f,__n);
            pEVar4 = (Exception *)((long)pEVar4->trace + (__n - 0x50));
            pEVar12 = pEVar12 + __n;
            uVar8 = uVar8 + __n;
          }
        }
        else {
          kj::_::Debug::Fault::Fault
                    (&f_2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1f7,iVar3,"sendfile","");
          uVar8 = (long)f.exception - (long)pEVar9;
          kj::_::Debug::Fault::~Fault(&f_2);
        }
        goto LAB_00282a11;
      }
    } while( true );
  }
  goto LAB_00282a22;
LAB_00282a0e:
  uVar8 = (long)f.exception - (long)pEVar9;
LAB_00282a11:
  pEVar9 = (Exception *)((long)pEVar9->trace + (uVar8 - 0x50));
  if (uVar8 < uVar5) {
LAB_00282ae1:
    return (int)pEVar9 - iVar2;
  }
  dst = dst + uVar8;
LAB_00282a22:
  if (pEVar9 == pEVar11) goto LAB_00282ad2;
  do {
    pEVar4 = (Exception *)lseek(__fd,(__off_t)pEVar9,3);
    if (-1 < (long)pEVar4) goto LAB_00282a98;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    if (iVar3 != 6) {
      if (iVar3 == 0x16) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x262,FAILED,(char *)0x0,
                   "\"can\'t determine hole size; SEEK_DATA not supported\"",
                   (char (*) [51])"can\'t determine hole size; SEEK_DATA not supported");
        kj::_::Debug::Fault::fatal(&f);
      }
      line = 0x26c;
LAB_00282b3c:
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,line,iVar3,"lseek(fd, pos, SEEK_HOLE)","");
      kj::_::Debug::Fault::~Fault(&f);
      return (int)pEVar9 - iVar2;
    }
    do {
      pEVar4 = (Exception *)lseek(__fd,0,2);
      if (-1 < (long)pEVar4) goto LAB_00282a83;
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x266,iVar3,"nextData = lseek(*otherFd, 0, SEEK_END)","");
      kj::_::Debug::Fault::fatal(&f);
    }
LAB_00282a83:
    if ((long)pEVar11 < (long)pEVar4) {
      pEVar11 = pEVar4;
    }
  }
LAB_00282a98:
  if ((long)pEVar11 < (long)pEVar4) {
    pEVar4 = pEVar11;
  }
  size = (long)pEVar4 - (long)pEVar9;
  if (size != 0 && (long)pEVar9 <= (long)pEVar4) {
    DiskHandle::zero(this_00,(uint64_t)dst,size);
    dst = dst + size;
    pEVar9 = pEVar4;
  }
  if (pEVar9 == pEVar11) {
LAB_00282ad2:
    return (int)pEVar11 - iVar2;
  }
  goto LAB_00282839;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t size) const override {
    KJ_IF_MAYBE(result, DiskHandle::copy(offset, from, fromOffset, size)) {
      return *result;
    } else {
      return File::copy(offset, from, fromOffset, size);
    }